

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zetDebugDetach(zet_debug_session_handle_t hDebug)

{
  _zet_debug_session_handle_t *_key;
  zet_pfnDebugDetach_t pfnDetach;
  dditable_t *dditable;
  ze_result_t result;
  zet_debug_session_handle_t hDebug_local;
  
  if (*(code **)(*(long *)(hDebug + 8) + 0x828) == (code *)0x0) {
    hDebug_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_zet_debug_session_handle_t **)hDebug;
    hDebug_local._4_4_ = (**(code **)(*(long *)(hDebug + 8) + 0x828))(_key);
    if (hDebug_local._4_4_ == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_zet_debug_session_handle_t_*>,__zet_debug_session_handle_t_*>::
      release((singleton_factory_t<object_t<_zet_debug_session_handle_t_*>,__zet_debug_session_handle_t_*>
               *)(context + 0xfc0),_key);
    }
  }
  return hDebug_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugDetach(
        zet_debug_session_handle_t hDebug               ///< [in][release] debug session handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_debug_session_object_t*>( hDebug )->dditable;
        auto pfnDetach = dditable->zet.Debug.pfnDetach;
        if( nullptr == pfnDetach )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDebug = reinterpret_cast<zet_debug_session_object_t*>( hDebug )->handle;

        // forward to device-driver
        result = pfnDetach( hDebug );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->zet_debug_session_factory.release( hDebug );

        return result;
    }